

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,PortalImageInfiniteLight *p,Transform *args,
          Image *args_1,RGBColorSpace **args_2,float *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *args_5,
          polymorphic_allocator<std::byte> *args_6)

{
  Float scale;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  RGBColorSpace *imageColorSpace;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_d0;
  Image local_b8;
  
  local_b8.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_b8.format = args_1->format;
  local_b8.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_1->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_b8.channelNames.alloc.memoryResource = (args_1->channelNames).alloc.memoryResource;
  local_b8.channelNames.ptr = (args_1->channelNames).ptr;
  auVar1 = *(undefined1 (*) [32])&(args_1->channelNames).nAlloc;
  (args_1->channelNames).nStored = 0;
  (args_1->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (args_1->channelNames).nAlloc = 0;
  auVar2._0_8_ = args_1->encoding;
  auVar2._8_8_ = (args_1->p8).alloc;
  auVar2._16_8_ = (args_1->p8).ptr;
  auVar2._24_8_ = (args_1->p8).nAlloc;
  local_b8._32_32_ = vperm2i128_avx2(auVar1,auVar2,0x20);
  local_b8.p8.nAlloc = (args_1->p8).nAlloc;
  local_b8.p8.nStored = (args_1->p8).nStored;
  local_b8.p8.ptr = (args_1->p8).ptr;
  (args_1->p8).nStored = 0;
  (args_1->p8).ptr = (uchar *)0x0;
  (args_1->p8).nAlloc = 0;
  local_b8.p16.alloc.memoryResource = (args_1->p16).alloc.memoryResource;
  local_b8.p16.nAlloc = (args_1->p16).nAlloc;
  local_b8.p16.nStored = (args_1->p16).nStored;
  local_b8.p16.ptr = (args_1->p16).ptr;
  (args_1->p16).nStored = 0;
  (args_1->p16).ptr = (Half *)0x0;
  (args_1->p16).nAlloc = 0;
  local_b8.p32.alloc.memoryResource = (args_1->p32).alloc.memoryResource;
  local_b8.p32.nAlloc = (args_1->p32).nAlloc;
  local_b8.p32.nStored = (args_1->p32).nStored;
  local_b8.p32.ptr = (args_1->p32).ptr;
  (args_1->p32).nStored = 0;
  (args_1->p32).ptr = (float *)0x0;
  (args_1->p32).nAlloc = 0;
  imageColorSpace = *args_2;
  scale = *args_3;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector(&local_d0,args_5);
  pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
            (p,args,&local_b8,imageColorSpace,scale,args_4,&local_d0,args_6->memoryResource);
  if (local_d0.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b8.p32);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_b8.p16);
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&local_b8.p8);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }